

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::modifyInitialFunctions(TranslateToFuzzReader *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  pointer func_00;
  Name *pNVar3;
  Expression *pEVar4;
  byte local_fa;
  byte local_f9;
  Name local_e8;
  uintptr_t local_d8;
  Name local_c0;
  undefined1 local_b0 [8];
  FunctionCreationContext context;
  Function *func;
  Index i;
  TranslateToFuzzReader *this_local;
  
  bVar1 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::empty(&this->wasm->functions);
  if (!bVar1) {
    for (func._4_4_ = 0;
        sVar2 = std::
                vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ::size(&this->wasm->functions), func._4_4_ < sVar2; func._4_4_ = func._4_4_ + 1) {
      this_00 = std::
                vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ::operator[](&this->wasm->functions,(ulong)func._4_4_);
      func_00 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_00);
      bVar1 = Importable::imported(&func_00->super_Importable);
      local_f9 = 0;
      if (bVar1) {
        IString::IString((IString *)&context.typeLocals._M_h._M_single_bucket,"fuzzing-support");
        bVar1 = IString::operator==(&(func_00->super_Importable).module.super_IString,
                                    (IString *)&context.typeLocals._M_h._M_single_bucket);
        local_fa = 1;
        if (!bVar1) {
          local_fa = this->preserveImportsAndExports;
        }
        local_f9 = local_fa;
      }
      if (((local_f9 & 1) == 0) && (bVar1 = Importable::imported(&func_00->super_Importable), bVar1)
         ) {
        FunctionCreationContext::FunctionCreationContext
                  ((FunctionCreationContext *)local_b0,this,func_00);
        Name::Name(&local_c0);
        pNVar3 = Name::operator=(&(func_00->super_Importable).base,&local_c0);
        Name::operator=(&(func_00->super_Importable).module,pNVar3);
        local_d8 = (uintptr_t)Function::getResults(func_00);
        pEVar4 = make(this,(Type)local_d8);
        func_00->body = pEVar4;
        FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)local_b0);
      }
    }
    Name::Name(&local_e8);
    Name::operator=(&this->wasm->start,&local_e8);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::modifyInitialFunctions() {
  if (wasm.functions.empty()) {
    return;
  }
  // Do not iterate directly on wasm.functions itself (that is, avoid
  //   for (x : wasm.functions)
  // ) as we may add to it as we go through the functions - make() can add new
  // functions to implement a RefFunc. Instead, use an index. This avoids an
  // iterator invalidation, and also we will process those new functions at
  // the end (currently that is not needed atm, but it might in the future).
  for (Index i = 0; i < wasm.functions.size(); i++) {
    auto* func = wasm.functions[i].get();
    // We can't allow extra imports, as the fuzzing infrastructure wouldn't
    // know what to provide. Keep only our own fuzzer imports (or, if we are
    // preserving imports, keep them all).
    if (func->imported() &&
        (func->module == "fuzzing-support" || preserveImportsAndExports)) {
      continue;
    }
    if (func->imported()) {
      FunctionCreationContext context(*this, func);
      func->module = func->base = Name();
      func->body = make(func->getResults());
    }
  }

  // Remove a start function - the fuzzing harness expects code to run only
  // from exports.
  wasm.start = Name();
}